

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

void __thiscall HttpHeaderBase::HttpHeaderBase(HttpHeaderBase *this)

{
  long lVar1;
  
  this->_vptr_HttpHeaderBase = (_func_int **)&PTR__HttpHeaderBase_00130530;
  (this->mHeaderStr)._M_dataplus._M_p = (pointer)&(this->mHeaderStr).field_2;
  (this->mHeaderStr)._M_string_length = 0;
  (this->mHeaderStr).field_2._M_local_buf[0] = '\0';
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&this->mFields[0].mType + lVar1) = 0;
    *(undefined8 *)((long)&this->mFields[0].mData + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x200);
  this->mNumFields = 0;
  JetHead::list<FieldMap_*>::list(&this->mFieldMappings);
  std::__cxx11::string::reserve((ulong)&this->mHeaderStr);
  return;
}

Assistant:

HttpHeaderBase::HttpHeaderBase()
	:	mNumFields(0)
{
	mHeaderStr.reserve(kDefaultMessageSize);
}